

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_logger.cpp
# Opt level: O1

void __thiscall juzzlin::SimpleLogger::Impl::prefixWithLevelAndTag(Impl *this,Level level)

{
  size_type sVar1;
  mapped_type *pmVar2;
  ostream *poVar3;
  long *plVar4;
  long *plVar5;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  Level local_4c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  local_4c = level;
  pmVar2 = std::
           map<juzzlin::SimpleLogger::Level,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<juzzlin::SimpleLogger::Level>,_std::allocator<std::pair<const_juzzlin::SimpleLogger::Level,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<juzzlin::SimpleLogger::Level,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<juzzlin::SimpleLogger::Level>,_std::allocator<std::pair<const_juzzlin::SimpleLogger::Level,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)m_symbols_abi_cxx11_,&local_4c);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&this->m_message,(pmVar2->_M_dataplus)._M_p,
                      pmVar2->_M_string_length);
  sVar1 = (this->m_tag)._M_string_length;
  if (sVar1 == 0) {
    local_70 = &local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  }
  else {
    std::operator+(&local_48," ",&this->m_tag);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_48);
    local_70 = &local_60;
    plVar5 = plVar4 + 2;
    if ((long *)*plVar4 == plVar5) {
      local_60 = *plVar5;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar5;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
  }
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_70,local_68);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if ((sVar1 != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2)) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void SimpleLogger::Impl::prefixWithLevelAndTag(SimpleLogger::Level level)
{
    m_message << m_symbols[level] << (!m_tag.empty() ? " " + m_tag + ":" : "") << " ";
}